

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fImplementationLimitTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ImplementationLimitTests::init
          (ImplementationLimitTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  undefined8 in_RAX;
  LimitQueryCase<int> *pLVar1;
  LimitQueryCase<deqp::gles2::Functional::LimitQuery::FloatRange> *pLVar2;
  LimitQueryCase<deqp::gles2::Functional::LimitQuery::Boolean> *this_00;
  FloatRange local_18;
  
  local_18.max = (float)((ulong)in_RAX >> 0x20);
  pLVar1 = (LimitQueryCase<int> *)operator_new(0x80);
  local_18.min = 5.60519e-45;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"subpixel_bits","GL_SUBPIXEL_BITS",0xd50,
             (int *)&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LimitQueryCase<int> *)operator_new(0x80);
  local_18.min = 8.96831e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"max_texture_size","GL_MAX_TEXTURE_SIZE",
             0xd33,(int *)&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LimitQueryCase<int> *)operator_new(0x80);
  local_18.min = 2.24208e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"max_cube_map_texture_size",
             "GL_MAX_CUBE_MAP_TEXTURE_SIZE",0x851c,(int *)&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar2 = (LimitQueryCase<deqp::gles2::Functional::LimitQuery::FloatRange> *)operator_new(0x88);
  local_18.min = 1.0;
  local_18.max = 1.0;
  LimitQueryCase<deqp::gles2::Functional::LimitQuery::FloatRange>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"aliased_point_size_range",
             "GL_ALIASED_POINT_SIZE_RANGE",0x846d,&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar2 = (LimitQueryCase<deqp::gles2::Functional::LimitQuery::FloatRange> *)operator_new(0x88);
  local_18.min = 1.0;
  local_18.max = 1.0;
  LimitQueryCase<deqp::gles2::Functional::LimitQuery::FloatRange>::LimitQueryCase
            (pLVar2,(this->super_TestCaseGroup).m_context,"aliased_line_width_range",
             "GL_ALIASED_LINE_WIDTH_RANGE",0x846e,&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar2);
  pLVar1 = (LimitQueryCase<int> *)operator_new(0x80);
  local_18 = (FloatRange)((ulong)local_18 & 0xffffffff00000000);
  LimitQueryCase<int>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"num_compressed_texture_formats",
             "GL_NUM_COMPRESSED_TEXTURE_FORMATS",0x86a2,(int *)&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LimitQueryCase<int> *)operator_new(0x80);
  local_18 = (FloatRange)((ulong)local_18 & 0xffffffff00000000);
  LimitQueryCase<int>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"num_shader_binary_formats",
             "GL_NUM_SHADER_BINARY_FORMATS",0x8df9,(int *)&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  this_00 = (LimitQueryCase<deqp::gles2::Functional::LimitQuery::Boolean> *)operator_new(0x80);
  local_18 = (FloatRange)((ulong)local_18 & 0xffffffffffffff00);
  LimitQueryCase<deqp::gles2::Functional::LimitQuery::Boolean>::LimitQueryCase
            (this_00,(this->super_TestCaseGroup).m_context,"shader_compiler","GL_SHADER_COMPILER",
             0x8dfa,(Boolean *)&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pLVar1 = (LimitQueryCase<int> *)operator_new(0x80);
  local_18.min = 1.12104e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"max_vertex_attribs",
             "GL_MAX_VERTEX_ATTRIBS",0x8869,(int *)&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LimitQueryCase<int> *)operator_new(0x80);
  local_18.min = 1.79366e-43;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"max_vertex_uniform_vectors",
             "GL_MAX_VERTEX_UNIFORM_VECTORS",0x8dfb,(int *)&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LimitQueryCase<int> *)operator_new(0x80);
  local_18.min = 1.12104e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"max_varying_vectors",
             "GL_MAX_VARYING_VECTORS",0x8dfc,(int *)&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LimitQueryCase<int> *)operator_new(0x80);
  local_18.min = 1.12104e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"max_combined_texture_image_units",
             "GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS",0x8b4d,(int *)&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LimitQueryCase<int> *)operator_new(0x80);
  local_18.min = 0.0;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"max_vertex_texture_image_units",
             "GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS",0x8b4c,(int *)&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LimitQueryCase<int> *)operator_new(0x80);
  local_18.min = 1.12104e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"max_texture_image_units",
             "GL_MAX_TEXTURE_IMAGE_UNITS",0x8872,(int *)&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LimitQueryCase<int> *)operator_new(0x80);
  local_18.min = 2.24208e-44;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"max_fragment_uniform_vectors",
             "GL_MAX_FRAGMENT_UNIFORM_VECTORS",0x8dfd,(int *)&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  pLVar1 = (LimitQueryCase<int> *)operator_new(0x80);
  local_18.min = 1.4013e-45;
  LimitQueryCase<int>::LimitQueryCase
            (pLVar1,(this->super_TestCaseGroup).m_context,"max_renderbuffer_size",
             "GL_MAX_RENDERBUFFER_SIZE",0x84e8,(int *)&local_18);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pLVar1);
  return extraout_EAX;
}

Assistant:

void ImplementationLimitTests::init (void)
{
#define LIMIT_CASE(NAME, PARAM, TYPE, MIN_VAL)	\
	addChild(new LimitQueryCase<TYPE>(m_context, #NAME, #PARAM, PARAM, MIN_VAL))

	LIMIT_CASE(subpixel_bits,						GL_SUBPIXEL_BITS,						GLint,		4);
	LIMIT_CASE(max_texture_size,					GL_MAX_TEXTURE_SIZE,					GLint,		64);
	LIMIT_CASE(max_cube_map_texture_size,			GL_MAX_CUBE_MAP_TEXTURE_SIZE,			GLint,		16);
	// GL_MAX_VIEWPORT_DIMS
	LIMIT_CASE(aliased_point_size_range,			GL_ALIASED_POINT_SIZE_RANGE,			FloatRange,	FloatRange(1,1));
	LIMIT_CASE(aliased_line_width_range,			GL_ALIASED_LINE_WIDTH_RANGE,			FloatRange,	FloatRange(1,1));
//	LIMIT_CASE(sample_buffers,						GL_SAMPLE_BUFFERS,						GLint,		0);
//	LIMIT_CASE(samples,								GL_SAMPLES,								GLint,		0);
	LIMIT_CASE(num_compressed_texture_formats,		GL_NUM_COMPRESSED_TEXTURE_FORMATS,		GLint,		0);
	LIMIT_CASE(num_shader_binary_formats,			GL_NUM_SHADER_BINARY_FORMATS,			GLint,		0);
	LIMIT_CASE(shader_compiler,						GL_SHADER_COMPILER,						Boolean,	GL_FALSE);
	// Shader precision format
	LIMIT_CASE(max_vertex_attribs,					GL_MAX_VERTEX_ATTRIBS,					GLint,		8);
	LIMIT_CASE(max_vertex_uniform_vectors,			GL_MAX_VERTEX_UNIFORM_VECTORS,			GLint,		128);
	LIMIT_CASE(max_varying_vectors,					GL_MAX_VARYING_VECTORS,					GLint,		8);
	LIMIT_CASE(max_combined_texture_image_units,	GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,	GLint,		8);
	LIMIT_CASE(max_vertex_texture_image_units,		GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS,		GLint,		0);
	LIMIT_CASE(max_texture_image_units,				GL_MAX_TEXTURE_IMAGE_UNITS,				GLint,		8);
	LIMIT_CASE(max_fragment_uniform_vectors,		GL_MAX_FRAGMENT_UNIFORM_VECTORS,		GLint,		16);
	LIMIT_CASE(max_renderbuffer_size,				GL_MAX_RENDERBUFFER_SIZE,				GLint,		1);
}